

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O3

string * cfgfile::
         format_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::qstring_trait_t>
         ::from_string(string *__return_storage_ptr__,
                      parser_info_t<cfgfile::qstring_trait_t> *param_1,string_t *value)

{
  QArrayData *pQVar1;
  QString local_20;
  
  pQVar1 = &((value->m_str).d.d)->super_QArrayData;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::toUtf8_helper(&local_20);
  if (local_20.d.ptr == (char16_t *)0x0) {
    local_20.d.ptr = (char16_t *)&QByteArray::_empty;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_20.d.ptr,local_20.d.size + (long)local_20.d.ptr)
  ;
  if (&(local_20.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_20.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_20.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_20.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_20.d.d)->super_QArrayData,1,8);
    }
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string from_string( const parser_info_t< qstring_trait_t > &,
		const qstring_trait_t::string_t & value )
	{
		return ((QString)value).toStdString();
	}